

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest::MergedDescriptorDatabaseTest
          (MergedDescriptorDatabaseTest *this)

{
  SimpleDescriptorDatabase *this_00;
  SimpleDescriptorDatabase *this_01;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MergedDescriptorDatabaseTest_01876228;
  this_00 = &this->database1_;
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(this_00);
  this_01 = &this->database2_;
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(this_01);
  MergedDescriptorDatabase::MergedDescriptorDatabase
            (&this->forward_merged_,&this_00->super_DescriptorDatabase,
             &this_01->super_DescriptorDatabase);
  MergedDescriptorDatabase::MergedDescriptorDatabase
            (&this->reverse_merged_,&this_01->super_DescriptorDatabase,
             &this_00->super_DescriptorDatabase);
  return;
}

Assistant:

MergedDescriptorDatabaseTest()
      : forward_merged_(&database1_, &database2_),
        reverse_merged_(&database2_, &database1_) {}